

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadTest::Program::Program
          (Program *this,SharedPtr<tcu::ThreadUtil::Event> *event,
          SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_30;
  SharedPtr<tcu::ThreadUtil::Event> local_20;
  
  local_20.m_ptr = event->m_ptr;
  local_20.m_state = event->m_state;
  if (local_20.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_20.m_state)->strongRefCount = (local_20.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_20.m_state)->weakRefCount = (local_20.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_30.m_ptr = sync->m_ptr;
  local_30.m_state = sync->m_state;
  if (local_30.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_30.m_state)->strongRefCount = (local_30.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_30.m_state)->weakRefCount = (local_30.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Object::Object(&this->super_Object,"Program",&local_20,&local_30);
  pSVar2 = local_30.m_state;
  if (local_30.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_30.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_30.m_ptr = (FenceSync *)0x0;
      (*(local_30.m_state)->_vptr_SharedPtrStateBase[2])(local_30.m_state);
    }
    LOCK();
    pdVar1 = &pSVar2->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_30.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_30.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_30.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pSVar2 = local_20.m_state;
  if (local_20.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_20.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_20.m_ptr = (Event *)0x0;
      (*(local_20.m_state)->_vptr_SharedPtrStateBase[2])(local_20.m_state);
    }
    LOCK();
    pdVar1 = &pSVar2->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_20.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_20.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  (this->super_Object).super_Object._vptr_Object = (_func_int **)&PTR__Program_003e7598;
  this->program = 0;
  this->runtimeVertexShader = 0;
  this->runtimeFragmentShader = 0;
  (this->vertexShader).m_ptr = (Shader *)0x0;
  (this->vertexShader).m_state = (SharedPtrStateBase *)0x0;
  (this->fragmentShader).m_ptr = (Shader *)0x0;
  (this->fragmentShader).m_state = (SharedPtrStateBase *)0x0;
  this->linked = false;
  return;
}

Assistant:

Program::Program (SharedPtr<tcu::ThreadUtil::Event> event, SharedPtr<FenceSync> sync)
	: Object					("Program", event, sync)
	, linked					(false)
	, program					(0)
	, runtimeVertexShader		(0)
	, runtimeFragmentShader		(0)
{
}